

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

vm_obj_id_t CVmBif::str_from_ui_str(char *str,size_t len)

{
  int iVar1;
  vm_obj_id_t vVar2;
  undefined4 extraout_var;
  CVmObject *this;
  undefined8 in_RSI;
  undefined8 in_RDI;
  CVmObjString *str_obj;
  vm_obj_id_t str_id;
  size_t outlen;
  char *outp;
  size_t in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int in_root_set;
  undefined8 local_20;
  char *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  in_root_set = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  local_18 = (char *)0x0;
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[4])
                    (G_cmap_from_ui_X,0,&local_20,in_RDI,in_RSI);
  local_20 = CONCAT44(extraout_var,iVar1);
  vVar2 = CVmObjString::create(in_root_set,in_stack_ffffffffffffffc8);
  this = vm_objp(0);
  local_18 = CVmObjString::cons_get_buf((CVmObjString *)this);
  (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[4])
            (G_cmap_from_ui_X,&local_18,&local_20,local_8,local_10);
  return vVar2;
}

Assistant:

vm_obj_id_t CVmBif::str_from_ui_str(VMG_ const char *str, size_t len)
{
    /* figure out how much space we need */
    char *outp = 0;
    size_t outlen = 0;
    outlen = G_cmap_from_ui->map(0, &outlen, str, len);

    /* allocate a string of that size */
    vm_obj_id_t str_id = CVmObjString::create(vmg_ FALSE, outlen);
    CVmObjString *str_obj = (CVmObjString *)vm_objp(vmg_ str_id);

    /* map the string into the new string buffer */
    outp = str_obj->cons_get_buf();
    G_cmap_from_ui->map(&outp, &outlen, str, len);

    /* return the new string object */
    return str_id;
}